

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

int __thiscall
CVmObjDate::sub_val(CVmObjDate *this,vm_val_t *result,vm_obj_id_t param_2,vm_val_t *val)

{
  int iVar1;
  int *piVar2;
  double dVar3;
  bignum_t<32> b;
  bignum_t<32> b_00;
  int iVar4;
  vm_obj_id_t vVar5;
  vm_datatype_t vVar6;
  int32_t iVar7;
  int daytime;
  int iVar8;
  bignum_t<32> d1;
  bignum_t<32> local_b8;
  bignum_t<32> t2;
  bignum_t<32> d2;
  bignum_t<32> t1;
  bignum_t<32> local_60;
  bignum_t<32> local_48;
  
  piVar2 = (int *)(this->super_CVmObject).ext_;
  iVar8 = *piVar2;
  daytime = piVar2[1];
  vVar6 = val->typ;
  if (vVar6 == VM_OBJ) {
    iVar4 = is_date_obj((val->val).obj);
    if (iVar4 != 0) {
      piVar2 = *(int **)((long)&G_obj_table_X.pages_[(val->val).obj >> 0xc][(val->val).obj & 0xfff].
                                ptr_ + 8);
      iVar4 = *piVar2;
      iVar1 = piVar2[1];
      bignum_t<32>::bignum_t(&d1,(long)iVar8);
      bignum_t<32>::bignum_t(&t1,(long)daytime);
      bignum_t<32>::bignum_t(&d2,(long)iVar4);
      bignum_t<32>::bignum_t(&t2,(long)iVar1);
      bignum_t<32>::operator/(&local_48,&t1,86400000);
      b.ext[8] = local_48.ext[8];
      b.ext[9] = local_48.ext[9];
      b.ext[10] = local_48.ext[10];
      b.ext[0xb] = local_48.ext[0xb];
      b.ext[0xc] = local_48.ext[0xc];
      b.ext[0] = local_48.ext[0];
      b.ext[1] = local_48.ext[1];
      b.ext[2] = local_48.ext[2];
      b.ext[3] = local_48.ext[3];
      b.ext[4] = local_48.ext[4];
      b.ext[5] = local_48.ext[5];
      b.ext[6] = local_48.ext[6];
      b.ext[7] = local_48.ext[7];
      b.ext[0xd] = local_48.ext[0xd];
      b.ext[0xe] = local_48.ext[0xe];
      b.ext[0xf] = local_48.ext[0xf];
      b.ext[0x10] = local_48.ext[0x10];
      b.ext[0x11] = local_48.ext[0x11];
      b.ext[0x12] = local_48.ext[0x12];
      b.ext[0x13] = local_48.ext[0x13];
      b.ext[0x14] = local_48.ext[0x14];
      bignum_t<32>::operator+=(&d1,b);
      bignum_t<32>::operator/(&local_60,&t2,86400000);
      b_00.ext[8] = local_60.ext[8];
      b_00.ext[9] = local_60.ext[9];
      b_00.ext[10] = local_60.ext[10];
      b_00.ext[0xb] = local_60.ext[0xb];
      b_00.ext[0xc] = local_60.ext[0xc];
      b_00.ext[0] = local_60.ext[0];
      b_00.ext[1] = local_60.ext[1];
      b_00.ext[2] = local_60.ext[2];
      b_00.ext[3] = local_60.ext[3];
      b_00.ext[4] = local_60.ext[4];
      b_00.ext[5] = local_60.ext[5];
      b_00.ext[6] = local_60.ext[6];
      b_00.ext[7] = local_60.ext[7];
      b_00.ext[0xd] = local_60.ext[0xd];
      b_00.ext[0xe] = local_60.ext[0xe];
      b_00.ext[0xf] = local_60.ext[0xf];
      b_00.ext[0x10] = local_60.ext[0x10];
      b_00.ext[0x11] = local_60.ext[0x11];
      b_00.ext[0x12] = local_60.ext[0x12];
      b_00.ext[0x13] = local_60.ext[0x13];
      b_00.ext[0x14] = local_60.ext[0x14];
      bignum_t<32>::operator+=(&d2,b_00);
      bignum_t<32>::operator-(&local_b8,&d1,&d2);
      vVar5 = CVmObjBigNum::create<32>(0,&local_b8);
      goto LAB_0024d433;
    }
    vVar6 = val->typ;
  }
  if (vVar6 == VM_INT) {
    iVar8 = iVar8 - (val->val).obj;
  }
  else {
    bignum_t<32>::bignum_t(&d1,val);
    dVar3 = CVmObjBigNum::ext_to_double(d1.ext);
    dVar3 = floor(dVar3);
    if ((2147483647.0 < dVar3 - (double)iVar8) || (dVar3 - (double)iVar8 < -2147483648.0)) {
      err_throw(0x7e7);
    }
    t2.ext._0_4_ = iVar8 - (int)dVar3;
    bignum_t<32>::operator-(&d2,&d1,dVar3);
    bignum_t<32>::operator*(&t1,&d2,86400000);
    dVar3 = CVmObjBigNum::ext_to_double(t1.ext);
    iVar7 = round_int32(dVar3);
    local_b8.ext._0_4_ = daytime - iVar7;
    caldate_t::normalize((int32_t *)&t2,(int32_t *)&local_b8);
    daytime = local_b8.ext._0_4_;
    iVar8 = t2.ext._0_4_;
  }
  vVar5 = create(0,iVar8,daytime);
LAB_0024d433:
  result->typ = VM_OBJ;
  (result->val).obj = vVar5;
  return 1;
}

Assistant:

int CVmObjDate::sub_val(VMG_ vm_val_t *result, vm_obj_id_t /*self*/,
                        const vm_val_t *val)
{
    /* get my date and time */
    int32_t dayno = get_ext()->dayno;
    int32_t daytime = get_ext()->daytime;

    /* the other value must be a Date or something numeric */
    if (val->typ == VM_OBJ && is_date_obj(vmg_ val->val.obj))
    {
        /* get the other date's contents */
        CVmObjDate *vdate = (CVmObjDate *)vm_objp(vmg_ val->val.obj);
        int32_t vdayno = vdate->get_ext()->dayno;
        int32_t vdaytime = vdate->get_ext()->daytime;

        /* we need fractional days, so calculate as bignum_t */
        bignum_t<32> d1((long)dayno), t1((long)daytime);
        bignum_t<32> d2((long)vdayno), t2((long)vdaytime);
        d1 += (t1 / (long)(24*60*60*1000));
        d2 += (t2 / (long)(24*60*60*1000));

        /* return a BigNumber containing the result */
        result->set_obj(CVmObjBigNum::create(vmg_ FALSE, d1 - d2));

        /* handled (we don't want to return a Date, as the other paths do) */
        return TRUE;
    }
    else if (val->typ == VM_INT)
    {
        /* it's a simple integer - subtract the number of days */
        dayno -= val->val.intval;
    }
    else
    {
        /* it's not an int; calculate in the bignum domain */
        bignum_t<32> d(vmg_ val);

        /* make sure the integer portion won't overflow */
        double dd = floor((double)d);
        if (dd - dayno > INT32MAXVAL || dd - dayno < INT32MINVAL)
            err_throw(VMERR_NUM_OVERFLOW);

        /* add the whole part to my day number */
        dayno -= (int32_t)dd;

        /* 
         *   convert the fractional part to milliseconds (by multiplying it
         *   by the number of milliseconds in a day), then subtract it from
         *   my time value 
         */
        daytime -= round_int32((double)((d - dd) * (long)(24L*60*60*1000)));

        /* normalize, to carry time overflow/underflow into the date */
        caldate_t::normalize(dayno, daytime);
    }

    /* return a new Date object representing the result */
    result->set_obj(create(vmg_ FALSE, dayno, daytime));

    /* handled */
    return TRUE;
}